

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void nn_hash_insert(nn_hash *self,uint32_t key,nn_hash_item *item)

{
  uint uVar1;
  nn_list *pnVar2;
  nn_list *pnVar3;
  uint32_t uVar4;
  int iVar5;
  nn_list_item *pnVar6;
  nn_list_item *pnVar7;
  nn_list *pnVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar4 = nn_hash_key(key);
  uVar10 = (ulong)uVar4 % (ulong)self->slots;
  pnVar6 = nn_list_begin(self->array + uVar10);
  do {
    pnVar7 = nn_list_end(self->array + uVar10);
    if (pnVar6 == pnVar7) {
      item->key = key;
      pnVar2 = self->array;
      pnVar6 = nn_list_end(pnVar2 + uVar10);
      nn_list_insert(pnVar2 + uVar10,&item->list,pnVar6);
      uVar1 = self->slots;
      uVar4 = self->items;
      self->items = uVar4 + 1;
      if ((int)uVar1 < 0 || uVar4 * 2 + 2 <= uVar1) {
        return;
      }
      pnVar2 = self->array;
      self->slots = uVar1 * 2;
      pnVar8 = (nn_list *)nn_alloc_((ulong)uVar1 << 5);
      self->array = pnVar8;
      if (pnVar8 != (nn_list *)0x0) {
        for (uVar9 = 0; uVar9 != self->slots; uVar9 = uVar9 + 1) {
          nn_list_init(self->array + uVar9);
        }
        for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
          pnVar8 = pnVar2 + uVar10;
          while( true ) {
            iVar5 = nn_list_empty(pnVar8);
            if (iVar5 != 0) break;
            nn_list_begin(pnVar8);
            pnVar6 = nn_list_begin(pnVar8);
            nn_list_erase(pnVar8,pnVar6);
            uVar4 = nn_hash_key(*(uint32_t *)&pnVar6[-1].prev);
            uVar9 = self->slots;
            pnVar3 = self->array;
            pnVar7 = nn_list_end(pnVar3 + (ulong)uVar4 % (ulong)uVar9);
            nn_list_insert(pnVar3 + (ulong)uVar4 % (ulong)uVar9,pnVar6,pnVar7);
          }
          nn_list_term(pnVar8);
        }
        nn_free(pnVar2);
        return;
      }
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/hash.c"
              ,0x43);
LAB_001acd70:
      fflush(_stderr);
      nn_err_abort();
    }
    if (*(uint32_t *)&pnVar6[-1].prev == key) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "nn_cont (it, struct nn_hash_item, list)->key != key",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/hash.c"
              ,0x65);
      goto LAB_001acd70;
    }
    pnVar6 = nn_list_next(self->array + uVar10,pnVar6);
  } while( true );
}

Assistant:

void nn_hash_insert (struct nn_hash *self, uint32_t key,
    struct nn_hash_item *item)
{
    struct nn_list_item *it;
    uint32_t i;

    i = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [i]);
          it != nn_list_end (&self->array [i]);
          it = nn_list_next (&self->array [i], it))
        nn_assert (nn_cont (it, struct nn_hash_item, list)->key != key);

    item->key = key;
    nn_list_insert (&self->array [i], &item->list,
        nn_list_end (&self->array [i]));
    ++self->items;

    /*  If the hash is getting full, double the amount of slots and
        re-hash all the items. */
    if (nn_slow (self->items * 2 > self->slots && self->slots < 0x80000000))
    nn_hash_rehash(self);
}